

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAEngine.h
# Opt level: O3

void __thiscall
Js::SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
          (SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_> *this,
          void *src,uint *dst)

{
  ScriptContext *scriptContext;
  SerializationCloner<Js::StreamWriter> *pSVar1;
  void *data;
  bool bVar2;
  SrcTypeId typeId;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  void *local_40;
  void *local_38;
  void *src_local;
  SCADeepCloneType deepClone;
  
  scriptContext =
       (this->m_cloner->
       super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
       ).super_ScriptContextHolder.m_scriptContext;
  local_38 = src;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (((src != (void *)0x0) && (bVar2 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(src), bVar2)
      ) && (this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(src),
           this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
    JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
  }
  typeId = SerializationCloner<Js::StreamWriter>::GetTypeId(this->m_cloner,src);
  bVar2 = SerializationCloner<Js::StreamWriter>::TryClonePrimitive(this->m_cloner,typeId,src,dst);
  if (bVar2) {
    return;
  }
  local_40 = src;
  bVar2 = JsUtil::
          BaseDictionary<void*,unsigned_int,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<void*>
                    ((BaseDictionary<void*,unsigned_int,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->m_clonedObjects,&local_40,dst);
  if (bVar2) {
    pSVar1 = this->m_cloner;
    src_local._4_4_ = *dst;
    local_40 = (void *)CONCAT44(local_40._4_4_,1);
    StreamWriter::Write<unsigned_int>(pSVar1->m_writer,(uint *)&local_40);
    StreamWriter::Write<unsigned_int>(pSVar1->m_writer,(uint *)((long)&src_local + 4));
    return;
  }
  bVar2 = SerializationCloner<Js::StreamWriter>::TryCloneObject
                    (this->m_cloner,typeId,src,dst,(SCADeepCloneType *)((long)&src_local + 4));
  if (!bVar2) {
    ScriptContextHolder::ThrowSCAUnsupported((ScriptContextHolder *)this->m_cloner);
  }
  JsUtil::
  BaseDictionary<void*,unsigned_int,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<void*,unsigned_int,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<void*,unsigned_int,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)this->m_clonedObjects,&local_38,dst);
  data = local_38;
  switch(src_local._4_4_) {
  case 1:
    goto switchD_00f0ef60_caseD_1;
  case 2:
    SerializationCloner<Js::StreamWriter>::CloneMap(this->m_cloner,local_38,*dst);
    break;
  case 3:
    SerializationCloner<Js::StreamWriter>::CloneSet(this->m_cloner,local_38,*dst);
    break;
  case 4:
    pSVar1 = this->m_cloner;
    local_40 = (void *)CONCAT44(local_40._4_4_,100);
    StreamWriter::Write<unsigned_int>(pSVar1->m_writer,(uint *)&local_40);
    StreamWriter::WriteHostObject(pSVar1->m_writer,data);
    return;
  default:
    return;
  }
  src_local._4_4_ = 1;
switchD_00f0ef60_caseD_1:
  SerializationCloner<Js::StreamWriter>::CloneProperties(this->m_cloner,typeId,local_38,*dst);
  return;
}

Assistant:

void Clone(Src src, Dst* dst)
        {
            PROBE_STACK(m_cloner->GetScriptContext(), Constants::MinStackDefault);

#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Src>(src);
#endif

            typename Cloner::SrcTypeId typeId = m_cloner->GetTypeId(src);

            if (m_cloner->TryClonePrimitive(typeId, src, dst))
            {
                return;
            }

            if (Cloner::ShouldLookupReference() && TryGetClonedObject(src, dst))
            {
                m_cloner->CloneObjectReference(src, *dst);
                return;
            }

            SCADeepCloneType deepClone;
            if (m_cloner->TryCloneObject(typeId, src, dst, &deepClone))
            {
                m_clonedObjects->Add(src, *dst);

                if (deepClone == SCADeepCloneType::Map)
                {
                    m_cloner->CloneMap(src, *dst);
                    deepClone = SCADeepCloneType::Object;
                }
                else if (deepClone == SCADeepCloneType::Set)
                {
                    m_cloner->CloneSet(src, *dst);
                    deepClone = SCADeepCloneType::Object;
                }

                if (deepClone == SCADeepCloneType::HostObject)
                {
                    m_cloner->CloneHostObjectProperties(typeId, src, *dst);
                }
                else if (deepClone == SCADeepCloneType::Object)
                {
                    m_cloner->CloneProperties(typeId, src, *dst);
                }
                return;
            }

            // Unsupported src type, throw
            m_cloner->ThrowSCAUnsupported();
        }